

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

bool __thiscall
TPZMatrix<std::complex<long_double>_>::Compare
          (TPZMatrix<std::complex<long_double>_> *this,TPZSavable *copy,bool override)

{
  undefined2 uVar1;
  int64_t iVar2;
  bool bVar3;
  long lVar4;
  ostream *poVar5;
  stringstream sout;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  if (copy == (TPZSavable *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = __dynamic_cast(copy,&TPZSavable::typeinfo,
                           &TPZMatrix<std::complex<long_double>>::typeinfo,0);
  }
  if (lVar4 == 0) {
    bVar3 = false;
  }
  else {
    if ((((this->super_TPZBaseMatrix).fRow != *(long *)(lVar4 + 8)) ||
        ((this->super_TPZBaseMatrix).fCol != *(long *)(lVar4 + 0x10))) ||
       (bVar3 = true, (this->super_TPZBaseMatrix).fDecomposed != *(char *)(lVar4 + 0x18))) {
      bVar3 = false;
    }
    if (!bVar3) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a0,
                 "virtual bool TPZMatrix<std::complex<long double>>::Compare(TPZSavable *, bool) [T = std::complex<long double>]"
                 ,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a0," did not compare ",0x11);
      std::__cxx11::stringbuf::str();
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_1d0,local_1c8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (local_1d0 != local_1c0) {
        operator_delete(local_1d0,local_1c0[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_1b0);
      std::ios_base::~ios_base(local_130);
    }
    if (override && !bVar3) {
      uVar1 = *(undefined2 *)(lVar4 + 0x18);
      (this->super_TPZBaseMatrix).fDecomposed = (char)uVar1;
      (this->super_TPZBaseMatrix).fDefPositive = (char)((ushort)uVar1 >> 8);
      iVar2 = *(int64_t *)(lVar4 + 0x10);
      (this->super_TPZBaseMatrix).fRow = *(int64_t *)(lVar4 + 8);
      (this->super_TPZBaseMatrix).fCol = iVar2;
    }
  }
  return bVar3;
}

Assistant:

bool TPZMatrix<TVar>::Compare(TPZSavable *copy, bool override)
{
	TPZMatrix<TVar> *copmat = dynamic_cast<TPZMatrix<TVar> *> (copy);
	if(!copmat) return false;
	bool result = true;
	if(fRow != copmat->fRow || fCol != copmat->fCol || fDecomposed != copmat->fDecomposed) result = false;
	if(!result)
	{
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " did not compare ";
		LOGPZ_ERROR(loggerCheck,sout.str())
	}
	if(override && !result)
	{
		this->operator=(*copmat);
	}
	return result;
}